

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMappedFile.cpp
# Opt level: O3

int __thiscall MemoryMappedFile::close(MemoryMappedFile *this,int __fd)

{
  int iVar1;
  int *piVar2;
  Log LStack_98;
  Log local_88;
  Log local_78;
  anon_union_8_2_1a2b307e_for_Flags<LogOutput::LogFlag>_1 local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  Log local_58;
  Log local_48;
  Log local_38;
  Log local_28;
  
  if (this->mpMapped != (void *)0x0) {
    iVar1 = munmap(this->mpMapped,this->mFileSize);
    if (iVar1 != 0) {
      local_68.mValue = 1;
      Log::Log(&local_78,LogLevel::Error,(Flags<LogOutput::LogFlag> *)&local_68);
      Log::write(&local_48,(int)&local_78,"Could not unmap ",0xffffffff);
      Log::write((Log *)&local_68,(int)&local_48,
                 (this->mFilename).super_String.mString._M_dataplus._M_p,
                 (ulong)(uint)(this->mFilename).super_String.mString._M_string_length);
      if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
      }
      Log::Log(&LStack_98,&local_48);
      Log::write(&local_88,(int)&LStack_98,". errno=",0xffffffff);
      __errno_location();
      Log::addStringStream<int>(&local_28,(int)&local_88);
      if (local_28.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_28.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_88.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_88.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (LStack_98.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (LStack_98.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_48.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_78.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
  }
  if (this->mFd != -1) {
    do {
      iVar1 = ::close(this->mFd);
      if (iVar1 != -1) goto LAB_0016c858;
      piVar2 = __errno_location();
    } while (*piVar2 == 4);
    local_68.mValue = 1;
    Log::Log(&local_78,LogLevel::Error,(Flags<LogOutput::LogFlag> *)&local_68);
    Log::write(&local_58,(int)&local_78,"Could not close file ",0xffffffff);
    Log::write((Log *)&local_68,(int)&local_58,
               (this->mFilename).super_String.mString._M_dataplus._M_p,
               (ulong)(uint)(this->mFilename).super_String.mString._M_string_length);
    if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
    }
    Log::Log(&LStack_98,&local_58);
    Log::write(&local_88,(int)&LStack_98,". errno=",0xffffffff);
    Log::addStringStream<int>(&local_38,(int)&local_88);
    if (local_38.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_88.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (LStack_98.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (LStack_98.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_58.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_78.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
LAB_0016c858:
    this->mFd = -1;
  }
  this->mFileSize = 0;
  (this->mFilename).super_String.mString._M_string_length = 0;
  *(this->mFilename).super_String.mString._M_dataplus._M_p = '\0';
  this->mpMapped = (void *)0x0;
  this->mAccessType = NO_ACCESS;
  return 0;
}

Assistant:

void MemoryMappedFile::close()
{
#ifdef _WIN32
    if(mpMapped && !UnmapViewOfFile(mpMapped))
    {
        error() << "Could not UnmapViewOfFile(). GetLastError()="
                << GetLastError();
    }
    closeHandleIfValid(mhFileMapping);
    closeHandleIfValid(mhFile);

#else  // ifdef _WIN32
    if(mpMapped != nullptr && munmap(mpMapped, mFileSize) != 0)
    {
        error() << "Could not unmap " << mFilename
                << ". errno=" << errno;
    }

    if(mFd != -1)
    {
        int ret;
        eintrwrap(ret, ::close(mFd));

        if(ret == -1)
        {
            error() << "Could not close file " << mFilename
                    << ". errno=" << errno;
        }

        mFd = -1;
    }

#endif

    mFileSize = 0;
    mFilename.clear();
    mpMapped = nullptr;
    mAccessType = NO_ACCESS;
}